

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void write_gg_palette_file(Config config,char *filename,Image *input_image)

{
  ostream *poVar1;
  long lVar2;
  uint16_t c;
  char buf [5];
  ofstream out;
  
  std::ofstream::ofstream(&out);
  std::ofstream::open((char *)&out,(_Ios_Openmode)filename);
  if (config.output_bin == false) {
    std::operator<<((ostream *)&out,".dw");
  }
  for (lVar2 = 10; lVar2 != 0x3a; lVar2 = lVar2 + 3) {
    c = (*(byte *)((long)input_image->palette + lVar2 + -8) & 0xf0) << 4 |
        *(byte *)((long)(input_image->palette + -3) + lVar2) & 0xfff0 |
        (ushort)(*(byte *)((long)input_image->palette + lVar2 + -10) >> 4);
    if (config.output_bin == false) {
      sprintf(buf,"%04X");
      poVar1 = std::operator<<((ostream *)&out," $");
      std::operator<<(poVar1,buf);
    }
    else {
      std::ostream::write((char *)&out,(long)&c);
    }
  }
  if (config.output_bin == false) {
    std::operator<<((ostream *)&out,"\n");
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&out);
  return;
}

Assistant:

void write_gg_palette_file(Config config, const char *filename, Image *input_image) {
    std::ofstream out;
    out.open(filename, config.output_bin ?
        std::ofstream::binary : std::ofstream::out);

    if (!config.output_bin) out << ".dw";

    for (int i = 0; i < MAX_COLOURS; i++) {
        uint16_t c = ((uint16_t) input_image->palette[i].red >> 4)
                   | (uint16_t) (input_image->palette[i].green >> 4) << 4
                   | (uint16_t) (input_image->palette[i].blue >> 4) << 8;

        if (!config.output_bin) {
            char buf[5];
            sprintf(buf, "%04X", c);
            out << " $" << buf;
        } else out.write((const char*)&c, 2);
    }
    if (!config.output_bin) out << "\n";

    out.close();
}